

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O3

string * __thiscall
deqp::gls::ShaderExecUtil::TessControlExecutor::generateTessControlShader_abi_cxx11_
          (string *__return_storage_ptr__,TessControlExecutor *this,ShaderSpec *shaderSpec)

{
  size_type sVar1;
  string *psVar2;
  bool bVar3;
  char *__s;
  size_t sVar4;
  ostream *poVar5;
  int iVar6;
  int ndx;
  int iVar7;
  bool bVar8;
  ostringstream src;
  ShaderSpec *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1b8 = (ShaderSpec *)this;
  __s = glu::getGLSLVersionDeclaration
                  (*(GLSLVersion *)
                    &(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(_func_int *)
                         ((long)&local_1b8 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0x10)
    ;
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  bVar3 = glu::glslVersionIsES
                    (*(GLSLVersion *)
                      &(((BufferIoExecutor *)&local_1b8->version)->super_ShaderExecutor).
                       _vptr_ShaderExecutor);
  if (bVar3 && *(int *)&(((BufferIoExecutor *)&local_1b8->version)->super_ShaderExecutor).
                        _vptr_ShaderExecutor < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  }
  sVar1 = (local_1b8->globalDeclarations)._M_string_length;
  if (sVar1 != 0) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (char *)(local_1b8->globalDeclarations)._M_dataplus._M_p,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nlayout(vertices = 1) out;\n\n",0x1c);
  BufferIoExecutor::declareBufferBlocks((ostream *)local_1a8,local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"void main (void)\n{\n",0x13);
  iVar6 = 0;
  iVar7 = 0;
  bVar3 = true;
  local_1b0 = __return_storage_ptr__;
  do {
    bVar8 = bVar3;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_TessLevelInner[",0x13);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = 1.0;\n",9);
    psVar2 = local_1b0;
    iVar6 = 1;
    bVar3 = false;
  } while (bVar8);
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tgl_TessLevelOuter[",0x13);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = 1.0;\n",9);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\thighp uint invocationId = uint(gl_PrimitiveID);\n",0x31);
  BufferIoExecutor::generateExecBufferIo((ostream *)local_1a8,local_1b8,"invocationId");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar2;
}

Assistant:

std::string TessControlExecutor::generateTessControlShader (const ShaderSpec& shaderSpec)
{
	std::ostringstream src;

	src << glu::getGLSLVersionDeclaration(shaderSpec.version) << "\n";

	if (glu::glslVersionIsES(shaderSpec.version) && shaderSpec.version <= glu::GLSL_VERSION_310_ES)
		src << "#extension GL_EXT_tessellation_shader : require\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	src << "\nlayout(vertices = 1) out;\n\n";

	declareBufferBlocks(src, shaderSpec);

	src << "void main (void)\n{\n";

	for (int ndx = 0; ndx < 2; ndx++)
		src << "\tgl_TessLevelInner[" << ndx << "] = 1.0;\n";

	for (int ndx = 0; ndx < 4; ndx++)
		src << "\tgl_TessLevelOuter[" << ndx << "] = 1.0;\n";

	src << "\n"
		<< "\thighp uint invocationId = uint(gl_PrimitiveID);\n";

	generateExecBufferIo(src, shaderSpec, "invocationId");

	src << "}\n";

	return src.str();
}